

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O0

void __thiscall vkt::synchronization::anon_unknown_0::TestContext::~TestContext(TestContext *this)

{
  TestContext *this_local;
  
  destroyFences(this->vkd,this->device,2,this->fences);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->imageAllocation);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&this->pipeline);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::~Move(&this->pipelineCache);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&this->renderPass);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&this->cmdBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&this->commandPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&this->framebuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&this->imageView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&this->image);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&this->renderBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&this->vertexBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->vertexBufferAllocation);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->renderReadBuffer);
  return;
}

Assistant:

~TestContext()
	{
		destroyFences(vkd, device, DE_LENGTH_OF_ARRAY(fences), fences);
	}